

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_json.cpp
# Opt level: O2

ComplexJSON * __thiscall duckdb::ComplexJSON::GetObject(ComplexJSON *this,string *key)

{
  iterator iVar1;
  mapped_type *this_00;
  type pCVar2;
  InvalidInputException *pIVar3;
  allocator local_39;
  string local_38;
  
  if (this->is_object != true) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"ComplexJson is not an object",&local_39);
    InvalidInputException::InvalidInputException(pIVar3,&local_38);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->obj_value)._M_h,key);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->obj_value,key);
    pCVar2 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
             operator*(this_00);
    return pCVar2;
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Complex JSON Key not found",&local_39);
  InvalidInputException::InvalidInputException(pIVar3,&local_38);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ComplexJSON &ComplexJSON::GetObject(const string &key) {
	if (is_object) {
		if (obj_value.find(key) == obj_value.end()) {
			throw InvalidInputException("Complex JSON Key not found");
		}
		return *obj_value[key];
	}
	throw InvalidInputException("ComplexJson is not an object");
}